

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_7::ToString<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long value)

{
  unsigned_long value_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T value) {
  if (std::is_floating_point<T>::value) {
    std::stringstream ss;
    ss << value;
    return ss.str();
  } else {
    return std::to_string(value);
  }
}